

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.cpp
# Opt level: O0

double deranged_cdf(int x,int a)

{
  int iVar1;
  int iVar2;
  undefined4 local_28;
  undefined4 local_24;
  int x2;
  int sum2;
  int dnmk;
  int cnk;
  double cdf;
  int a_local;
  int x_local;
  
  if ((x < 0) || (a < x)) {
    _dnmk = 0.0;
  }
  else {
    local_24 = 0;
    for (local_28 = 0; local_28 <= x; local_28 = local_28 + 1) {
      iVar1 = i4_choose(a,local_28);
      iVar2 = deranged_enum(a - local_28);
      local_24 = local_24 + iVar1 * iVar2;
    }
    _dnmk = r8_factorial(a);
    _dnmk = (double)local_24 / _dnmk;
  }
  return _dnmk;
}

Assistant:

double deranged_cdf ( int x, int a )

//****************************************************************************80
//
//  Purpose:
//
//    DERANGED_CDF evaluates the Deranged CDF.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    13 October 2004
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, int X, the maximum number of items in their correct places.
//    0 <= X <= A.
//
//    Input, int A, the number of items.
//    1 <= A.
//
//    Output, double CDF, the value of the CDF.
//
{
  double cdf;
  int cnk;
  int dnmk;
  int sum2;
  int x2;

  if ( x < 0 || a < x )
  {
    cdf = 0.0;
  }
  else
  {
    sum2 = 0;
    for ( x2 = 0; x2 <= x; x2++ )
    {
      cnk = i4_choose ( a, x2 );
      dnmk = deranged_enum ( a - x2 );
      sum2 = sum2 + cnk * dnmk;
    }
    cdf = static_cast<double>(sum2 ) / r8_factorial ( a );
  }

  return cdf;
}